

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.h
# Opt level: O3

ExpVal * __thiscall ExpVal::operator=(ExpVal *this,ExpVal *o)

{
  PType *pPVar1;
  
  if (this->Type == (PType *)TypeString) {
    FString::~FString((FString *)&this->field_1);
  }
  pPVar1 = o->Type;
  this->Type = pPVar1;
  if (pPVar1 == (PType *)TypeString) {
    FString::AttachToOther((FString *)&this->field_1,(FString *)&o->field_1);
  }
  else {
    this->field_1 = o->field_1;
  }
  return this;
}

Assistant:

ExpVal &operator=(const ExpVal &o)
	{
		if (Type == TypeString)
		{
			((FString *)&pointer)->~FString();
		}
		Type = o.Type;
		if (o.Type == TypeString)
		{
			::new(&pointer) FString(*(FString *)&o.pointer);
		}
		else
		{
			memcpy(&Float, &o.Float, 8);
		}
		return *this;
	}